

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

ImPlotColormap ImPlot::AddColormap(char *name,ImVec4 *colormap,int size,bool qual)

{
  ImPlotContext *pIVar1;
  ImGuiID key;
  int iVar2;
  ImU32 IVar3;
  ulong uVar4;
  ulong uVar5;
  ImVector<unsigned_int> buffer;
  ImU32 *pIStack_40;
  
  pIVar1 = GImPlot;
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcf7,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)");
  }
  key = ImHashStr(name,0,0);
  iVar2 = ImGuiStorage::GetInt(&(pIVar1->ColormapData).Map,key,-1);
  if (iVar2 != -1) {
    __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already been used!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcf8,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)");
  }
  pIStack_40 = (ImU32 *)0x0;
  if (0 < size) {
    uVar4 = 8;
    if (7 < size) {
      uVar4 = (ulong)(uint)size;
    }
    if (0 < (int)uVar4) {
      pIStack_40 = (ImU32 *)ImGui::MemAlloc(uVar4 << 2);
    }
  }
  uVar4 = 1;
  if (1 < size) {
    uVar4 = (ulong)(uint)size;
  }
  uVar5 = 0;
  do {
    IVar3 = ImGui::ColorConvertFloat4ToU32(colormap);
    if ((long)size <= (long)uVar5) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
    }
    pIStack_40[uVar5] = IVar3;
    uVar5 = uVar5 + 1;
    colormap = colormap + 1;
  } while (uVar4 != uVar5);
  iVar2 = ImPlotColormapData::Append(&pIVar1->ColormapData,name,pIStack_40,size,qual);
  if (pIStack_40 != (ImU32 *)0x0) {
    ImGui::MemFree(pIStack_40);
  }
  return iVar2;
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImVec4* colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already been used!");
    ImVector<ImU32> buffer;
    buffer.resize(size);
    for (int i = 0; i < size; ++i)
        buffer[i] = ImGui::ColorConvertFloat4ToU32(colormap[i]);
    return gp.ColormapData.Append(name, buffer.Data, size, qual);
}